

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_text_proto.h
# Opt level: O1

FileDescriptorSet * __thiscall
upb_test::ParseTextProtoOrDie::operator_cast_to_FileDescriptorSet
          (FileDescriptorSet *__return_storage_ptr__,ParseTextProtoOrDie *this)

{
  bool bVar1;
  Message *in_RCX;
  string_view input;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_20;
  AssertHelper local_18;
  
  google::protobuf::FileDescriptorSet::FileDescriptorSet(__return_storage_ptr__,(Arena *)0x0);
  input._M_str = (char *)__return_storage_ptr__;
  input._M_len = (size_t)(this->text_proto_)._M_dataplus._M_p;
  bVar1 = google::protobuf::TextFormat::ParseFromString
                    ((TextFormat *)(this->text_proto_)._M_string_length,input,in_RCX);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  testing::Message::Message((Message *)&local_20);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_20._M_head_impl + 0x10),"Failed to parse textproto: ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_20._M_head_impl + 0x10),(this->text_proto_)._M_dataplus._M_p,
             (this->text_proto_)._M_string_length);
  testing::internal::AssertHelper::AssertHelper
            (&local_18,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/test/parse_text_proto.h"
             ,0x20,"Failed");
  testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_20);
  testing::internal::AssertHelper::~AssertHelper(&local_18);
  if (local_20._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_20._M_head_impl + 8))();
  }
  abort();
}

Assistant:

operator T() {  // NOLINT: Needed to support parsing text proto as appropriate
                  // type.
    T message;
    if (!google::protobuf::TextFormat::ParseFromString(text_proto_, &message)) {
      ADD_FAILURE() << "Failed to parse textproto: " << text_proto_;
      abort();
    }
    return message;
  }